

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cc
# Opt level: O2

void __thiscall ArgParser::test_exceptions(ArgParser *this)

{
  function<void_()> *in_RDX;
  function<void_()> *fn;
  function<void_()> *fn_00;
  function<void_()> *fn_01;
  function<void_()> *fn_02;
  function<void_()> *fn_03;
  function<void_()> *fn_04;
  function<void_()> *fn_05;
  function<void_()> *fn_06;
  function<void_()> *fn_07;
  function<void_()> *fn_08;
  _Any_data local_170;
  code *local_160;
  code *local_158;
  _Any_data local_150;
  code *local_140;
  code *local_138;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:167:30)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:167:30)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"duplicate handler",local_30._M_pod_data,in_RDX);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:171:30)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:171:30)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"duplicate handler",local_50._M_pod_data,fn);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:175:28)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:175:28)>
             ::_M_manager;
  local_70._M_unused._M_object = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"duplicate table",local_70._M_pod_data,fn_00);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:176:26)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:176:26)>
             ::_M_manager;
  local_90._M_unused._M_object = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"unknown table",local_90._M_pod_data,fn_01);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  local_b0._8_8_ = 0;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:177:36)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:177:36)>
             ::_M_manager;
  local_b0._M_unused._M_object = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"add existing help topic",local_b0._M_pod_data,fn_02);
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:178:36)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:178:36)>
             ::_M_manager;
  local_d0._M_unused._M_object = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"add reserved help topic",local_d0._M_pod_data,fn_03);
  std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  local_f0._8_8_ = 0;
  local_d8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:179:33)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:179:33)>
             ::_M_manager;
  local_f0._M_unused._M_object = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"add to unknown topic",local_f0._M_pod_data,fn_04);
  std::_Function_base::~_Function_base((_Function_base *)&local_f0);
  local_110._8_8_ = 0;
  local_f8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:180:32)>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:180:32)>
              ::_M_manager;
  local_110._M_unused._M_object = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"bad option for help",local_110._M_pod_data,fn_05);
  std::_Function_base::~_Function_base((_Function_base *)&local_110);
  local_130._8_8_ = 0;
  local_118 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:181:31)>
              ::_M_invoke;
  local_120 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:181:31)>
              ::_M_manager;
  local_130._M_unused._M_object = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"bad topic for help",local_130._M_pod_data,fn_06);
  std::_Function_base::~_Function_base((_Function_base *)&local_130);
  local_150._8_8_ = 0;
  local_138 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:183:9)>
              ::_M_invoke;
  local_140 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:183:9)>
              ::_M_manager;
  local_150._M_unused._M_object = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"duplicate option help",local_150._M_pod_data,fn_07);
  std::_Function_base::~_Function_base((_Function_base *)&local_150);
  local_170._8_8_ = 0;
  local_158 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:185:9)>
              ::_M_invoke;
  local_160 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/arg_parser.cc:185:9)>
              ::_M_manager;
  local_170._M_unused._M_object = this;
  test_exceptions::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)"invalid choice handler to unknown",local_170._M_pod_data,
             fn_08);
  std::_Function_base::~_Function_base((_Function_base *)&local_170);
  return;
}

Assistant:

void
ArgParser::test_exceptions()
{
    auto err = [](char const* msg, std::function<void()> fn) {
        try {
            fn();
            assert(msg == nullptr);
        } catch (std::exception& e) {
            std::cout << msg << ": " << e.what() << std::endl;
        }
    };

    err("duplicate handler", [this]() {
        ap.selectMainOptionTable();
        ap.addBare("potato", []() {});
    });
    err("duplicate handler", [this]() {
        ap.selectOptionTable("baaa");
        ap.addBare("ram", []() {});
    });
    err("duplicate table", [this]() { ap.registerOptionTable("baaa", nullptr); });
    err("unknown table", [this]() { ap.selectOptionTable("aardvark"); });
    err("add existing help topic", [this]() { ap.addHelpTopic("baaa", "potato", "salad"); });
    err("add reserved help topic", [this]() { ap.addHelpTopic("all", "potato", "salad"); });
    err("add to unknown topic", [this]() { ap.addOptionHelp("--new", "oops", "potato", "salad"); });
    err("bad option for help", [this]() { ap.addOptionHelp("nodash", "baaa", "potato", "salad"); });
    err("bad topic for help", [this]() { ap.addHelpTopic("--dashes", "potato", "salad"); });
    err("duplicate option help",
        [this]() { ap.addOptionHelp("--ewe", "baaa", "potato", "salad"); });
    err("invalid choice handler to unknown",
        [this]() { ap.addInvalidChoiceHandler("elephant", [](std::string const&) {}); });
}